

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandler::CleanCoverageLogFiles(cmCTestCoverageHandler *this,ostream *log)

{
  cmCTest *this_00;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference source;
  ostream *poVar2;
  string *f;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  Glob gl;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string logGlob;
  ostream *log_local;
  cmCTestCoverageHandler *this_local;
  
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  logGlob.field_2._8_8_ = log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"BuildDirectory",&local_79)
  ;
  cmCTest::GetCTestConfiguration(&local_58,this_00,&local_78);
  cmCTest::GetCurrentTag_abi_cxx11_
            ((string *)&gl.ListDirs,(this->super_cmCTestGenericHandler).CTest);
  cmStrCat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[14]>
            ((string *)local_38,&local_58,(char (*) [10])"/Testing/",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl.ListDirs,
             (char (*) [14])"/CoverageLog*");
  std::__cxx11::string::~string((string *)&gl.ListDirs);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  cmsys::Glob::Glob((Glob *)&files);
  cmsys::Glob::FindFiles((Glob *)&files,(string *)local_38,(GlobMessages *)0x0);
  this_01 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&files);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_01);
  f = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&f);
    if (!bVar1) break;
    source = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)logGlob.field_2._8_8_,"Removing old coverage log: ");
    poVar2 = std::operator<<(poVar2,(string *)source);
    std::operator<<(poVar2,"\n");
    cmsys::SystemTools::RemoveFile(source);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmsys::Glob::~Glob((Glob *)&files);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmCTestCoverageHandler::CleanCoverageLogFiles(std::ostream& log)
{
  std::string logGlob =
    cmStrCat(this->CTest->GetCTestConfiguration("BuildDirectory"), "/Testing/",
             this->CTest->GetCurrentTag(), "/CoverageLog*");
  cmsys::Glob gl;
  gl.FindFiles(logGlob);
  std::vector<std::string> const& files = gl.GetFiles();
  for (std::string const& f : files) {
    log << "Removing old coverage log: " << f << "\n";
    cmSystemTools::RemoveFile(f);
  }
}